

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

Var __thiscall
Js::TypedArrayBase::FindMinOrMax<float,true>
          (TypedArrayBase *this,ScriptContext *scriptContext,bool findMax)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  Var pvVar8;
  ulong uVar9;
  long lVar10;
  float local_34;
  
  pfVar3 = (float *)this->buffer;
  uVar9 = (ulong)(this->super_ArrayBufferParent).super_ArrayObject.length;
  uVar2 = this->byteOffset;
  uVar6 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar6 < (ulong)uVar2 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9e8,
                                "(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())",
                                "sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()");
    if (!bVar5) {
LAB_00d6ee38:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  local_34 = *pfVar3;
  if (uVar9 != 0) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    lVar10 = 0;
    do {
      uVar2 = this->byteOffset;
      uVar6 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x71])();
      if ((ulong)uVar6 < lVar10 + (ulong)uVar2 + 4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                    ,0x9ec,
                                    "((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                    ,
                                    "(i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                   );
        if (!bVar5) goto LAB_00d6ee38;
        *puVar7 = 0;
      }
      fVar1 = *(float *)((long)pfVar3 + lVar10);
      bVar5 = NumberUtilities::IsNan((double)fVar1);
      if (bVar5) {
        return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).nan.ptr;
      }
      if (findMax) {
        if (local_34 < fVar1) {
LAB_00d6ede9:
          local_34 = fVar1;
        }
      }
      else if ((fVar1 < local_34) ||
              (((fVar1 == 0.0 && (!NAN(fVar1))) &&
               (bVar5 = NumberUtilities::IsSpecial((double)local_34,0x8000000000000000), bVar5))))
      goto LAB_00d6ede9;
      lVar10 = lVar10 + 4;
    } while (uVar9 << 2 != lVar10);
  }
  pvVar8 = JavascriptNumber::ToVarNoCheck((double)local_34,scriptContext);
  return pvVar8;
}

Assistant:

Var TypedArrayBase::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        T* typedBuffer = (T*)this->buffer;
        uint len = this->GetLength();

        Assert(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
        T currentRes = typedBuffer[0];
        for (uint i = 0; i < len; i++)
        {
            Assert((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            T compare = typedBuffer[i];
            if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
            if (findMax ? currentRes < compare : currentRes > compare ||
                (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
            {
                currentRes = compare;
            }
        }
        return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
    }